

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          bool syntheticEvents,WatcherInotify *parent,bool fromInternalEvent)

{
  FileInfo *this_00;
  pointer pcVar1;
  WatchID WVar2;
  FileWatchListener *pFVar3;
  bool bVar4;
  int iVar5;
  Error EVar6;
  bool *pbVar7;
  WatcherInotify *pWVar8;
  int *piVar9;
  ulong uVar10;
  ulong *puVar11;
  mapped_type *ppWVar12;
  _Base_ptr p_Var13;
  char *pcVar14;
  _Alloc_hider _Var15;
  undefined7 in_register_00000081;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string dir;
  string link;
  string curPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  files;
  FileInfo fi;
  string local_2f0;
  undefined4 local_2cc;
  WatcherInotify *local_2c8;
  undefined8 local_2c0;
  Error local_2b4;
  key_type *local_2b0;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  _Rb_tree_node_base local_220;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  local_2cc = (undefined4)CONCAT71(in_register_00000081,syntheticEvents);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  pcVar1 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,pcVar1,pcVar1 + directory->_M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_2f0);
  FileInfo::FileInfo(&local_78,&local_2f0);
  bVar4 = FileInfo::isDirectory(&local_78);
  if (bVar4) {
    bVar4 = FileInfo::isReadable(&local_78);
    if (!bVar4) {
      paVar16 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_2f0._M_dataplus._M_p,
                 local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
      EVar6 = Errors::Log::createLastError(FileNotReadable,&local_d8);
      _Var15._M_p = local_d8._M_dataplus._M_p;
      goto LAB_0010bc5a;
    }
    iVar5 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_2f0);
    if ((char)iVar5 != '\0') {
      paVar16 = &local_f8.field_2;
      pcVar1 = (directory->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar1,pcVar1 + directory->_M_string_length);
      EVar6 = Errors::Log::createLastError(FileRepeated,&local_f8);
      _Var15._M_p = local_f8._M_dataplus._M_p;
      goto LAB_0010bc5a;
    }
    if ((parent != (WatcherInotify *)0x0) && (bVar4 = FileSystem::isRemoteFS(&local_2f0), bVar4)) {
      paVar16 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_2f0._M_dataplus._M_p,
                 local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
      EVar6 = Errors::Log::createLastError(FileRemote,&local_118);
      _Var15._M_p = local_118._M_dataplus._M_p;
      goto LAB_0010bc5a;
    }
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_2f0._M_dataplus._M_p,
               local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
    FileSystem::getLinkRealPath(&local_268,&local_138,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_268);
    if (iVar5 == 0) {
LAB_0010be2b:
      EVar6 = inotify_add_watch(this->mFD,local_2f0._M_dataplus._M_p,0x3ca);
      if (EVar6 < NoError) {
        piVar9 = __errno_location();
        if (*piVar9 == 2) {
          paVar16 = &local_1b8.field_2;
          local_1b8._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_2f0._M_dataplus._M_p,
                     local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
          EVar6 = Errors::Log::createLastError(FileNotFound,&local_1b8);
          local_98._M_dataplus._M_p = local_1b8._M_dataplus._M_p;
          goto LAB_0010c23b;
        }
        pcVar14 = strerror(*piVar9);
        std::__cxx11::string::string((string *)&local_98,pcVar14,(allocator *)local_228);
        EVar6 = Errors::Log::createLastError(Unspecified,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0010c245;
        goto LAB_0010c240;
      }
      pWVar8 = (WatcherInotify *)operator_new(0xc0);
      WatcherInotify::WatcherInotify(pWVar8);
      (pWVar8->super_Watcher).Listener = watcher;
      local_2c0 = (ulong)(uint)EVar6;
      uVar10 = local_2c0;
      if (parent != (WatcherInotify *)0x0) {
        uVar10 = (parent->super_Watcher).ID;
      }
      (pWVar8->super_Watcher).ID = uVar10;
      pWVar8->InotifyID = local_2c0;
      local_2b0 = &(pWVar8->super_Watcher).Directory;
      std::__cxx11::string::_M_assign((string *)local_2b0);
      (pWVar8->super_Watcher).Recursive = recursive;
      pWVar8->Parent = parent;
      Mutex::lock(&this->mWatchesLock);
      local_2c8 = pWVar8;
      local_228._0_4_ = EVar6;
      local_220._0_8_ = pWVar8;
      std::
      _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
      ::_M_emplace_unique<std::pair<int,efsw::WatcherInotify*>>
                ((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                  *)&this->mWatches,(pair<int,_efsw::WatcherInotify_*> *)local_228);
      puVar11 = (ulong *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&this->mWatchesRef,local_2b0);
      *puVar11 = local_2c0;
      Mutex::unlock(&this->mWatchesLock);
      pWVar8 = local_2c8;
      if (local_2c8->Parent == (WatcherInotify *)0x0) {
        Mutex::lock(&this->mRealWatchesLock);
        pWVar8 = local_2c8;
        ppWVar12 = std::
                   map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                   ::operator[](&this->mRealWatches,&local_2c8->InotifyID);
        *ppWVar12 = pWVar8;
        Mutex::unlock(&this->mRealWatchesLock);
      }
      if ((pWVar8->super_Watcher).Recursive == true) {
        pcVar1 = (pWVar8->super_Watcher).Directory._M_dataplus._M_p;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar1,
                   pcVar1 + (pWVar8->super_Watcher).Directory._M_string_length);
        FileSystem::filesInfoFromPath((FileInfoMap *)local_228,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if (local_220._M_left != &local_220) {
          local_2c0 = CONCAT44(local_2c0._4_4_,local_2cc) & 0xffffffff000000ff;
          p_Var13 = local_220._M_left;
          do {
            if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) break;
            this_00 = (FileInfo *)(p_Var13 + 2);
            bVar4 = FileInfo::isDirectory(this_00);
            if ((bVar4) && (bVar4 = FileInfo::isReadable(this_00), bVar4)) {
              addWatch(this,(string *)this_00,watcher,recursive,SUB81(local_2c0,0),local_2c8,false);
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          } while (p_Var13 != &local_220);
        }
        if ((((parent != (WatcherInotify *)0x0 && fromInternalEvent) & (byte)local_2cc) == 1) &&
           (local_220._M_left != &local_220)) {
          p_Var13 = local_220._M_left;
          local_2b4 = EVar6;
          do {
            bVar4 = FileInfo::isRegularFile((FileInfo *)(p_Var13 + 2));
            if (bVar4) {
              WVar2 = (local_2c8->super_Watcher).ID;
              pFVar3 = (local_2c8->super_Watcher).Listener;
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_288,*(long *)(p_Var13 + 2),
                         (long)&(p_Var13[2]._M_parent)->_M_color + *(long *)(p_Var13 + 2));
              FileSystem::fileNameFromPath(&local_1f8,&local_288);
              local_2a8[0] = local_298;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
              (*pFVar3->_vptr_FileWatchListener[2])
                        (pFVar3,WVar2,local_2b0,&local_1f8,1,(string *)local_2a8);
              EVar6 = local_2b4;
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0]);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p);
              }
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          } while (p_Var13 != &local_220);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     *)local_228);
      }
    }
    else {
      if ((parent == (WatcherInotify *)0x0) ||
         (pbVar7 = FileWatcher::followSymlinks((this->super_FileWatcherImpl).mFileWatcher),
         *pbVar7 != false)) {
        iVar5 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_268);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])
                            (this,&local_248,&local_268);
          if ((char)iVar5 != '\0') {
            std::__cxx11::string::_M_assign((string *)&local_2f0);
            goto LAB_0010be2b;
          }
          paVar16 = &local_198.field_2;
          local_198._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_2f0._M_dataplus._M_p,
                     local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
          EVar6 = Errors::Log::createLastError(FileOutOfScope,&local_198);
          local_98._M_dataplus._M_p = local_198._M_dataplus._M_p;
        }
        else {
          paVar16 = &local_178.field_2;
          pcVar1 = (directory->_M_dataplus)._M_p;
          local_178._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar1,pcVar1 + directory->_M_string_length);
          EVar6 = Errors::Log::createLastError(FileRepeated,&local_178);
          local_98._M_dataplus._M_p = local_178._M_dataplus._M_p;
        }
      }
      else {
        paVar16 = &local_158.field_2;
        local_158._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        EVar6 = Errors::Log::createLastError(FileOutOfScope,&local_158);
        local_98._M_dataplus._M_p = local_158._M_dataplus._M_p;
      }
LAB_0010c23b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar16) {
LAB_0010c240:
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
LAB_0010c245:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    _Var15._M_p = local_248._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_0010bc64;
  }
  else {
    paVar16 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_2f0._M_dataplus._M_p,
               local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
    EVar6 = Errors::Log::createLastError(FileNotFound,&local_b8);
    _Var15._M_p = local_b8._M_dataplus._M_p;
LAB_0010bc5a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p == paVar16) goto LAB_0010bc64;
  }
  operator_delete(_Var15._M_p);
LAB_0010bc64:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  return (long)EVar6;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, bool syntheticEvents,
									  WatcherInotify* parent, bool fromInternalEvent ) {
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() ) {
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	} else if ( !fi.isReadable() ) {
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	} else if ( pathInWatches( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRepeated, directory );
	} else if ( NULL != parent && FileSystem::isRemoteFS( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRemote, dir );
	}

	/// Check if the directory is a symbolic link
	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( NULL != parent && !mFileWatcher->followSymlinks() ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( pathInWatches( link ) ) {
			return Errors::Log::createLastError( Errors::FileRepeated, directory );
		} else if ( !linkAllowed( curPath, link ) ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		} else {
			dir = link;
		}
	}

	int wd = inotify_add_watch( mFD, dir.c_str(),
								IN_CLOSE_WRITE | IN_MOVED_TO | IN_CREATE | IN_MOVED_FROM |
									IN_DELETE | IN_MODIFY );

	if ( wd < 0 ) {
		if ( errno == ENOENT ) {
			return Errors::Log::createLastError( Errors::FileNotFound, dir );
		} else {
			return Errors::Log::createLastError( Errors::Unspecified,
												 std::string( strerror( errno ) ) );
		}
	}

	efDEBUG( "Added watch %s with id: %d\n", dir.c_str(), wd );

	WatcherInotify* pWatch = new WatcherInotify();
	pWatch->Listener = watcher;
	pWatch->ID = parent ? parent->ID : wd;
	pWatch->InotifyID = wd;
	pWatch->Directory = dir;
	pWatch->Recursive = recursive;
	pWatch->Parent = parent;

	{
		Lock lock( mWatchesLock );
		mWatches.insert( std::make_pair( wd, pWatch ) );
		mWatchesRef[pWatch->Directory] = wd;
	}

	if ( NULL == pWatch->Parent ) {
		Lock l( mRealWatchesLock );
		mRealWatches[pWatch->InotifyID] = pWatch;
	}

	if ( pWatch->Recursive ) {
		std::map<std::string, FileInfo> files = FileSystem::filesInfoFromPath( pWatch->Directory );
		std::map<std::string, FileInfo>::iterator it = files.begin();

		for ( ; it != files.end(); ++it ) {
			if ( !mInitOK )
				break;

			const FileInfo& cfi = it->second;

			if ( cfi.isDirectory() && cfi.isReadable() ) {
				addWatch( cfi.Filepath, watcher, recursive, syntheticEvents, pWatch );
			}
		}

		if ( fromInternalEvent && parent != NULL && syntheticEvents ) {
			for ( const auto& file : files ) {
				if ( file.second.isRegularFile() ) {
					pWatch->Listener->handleFileAction(
						pWatch->ID, pWatch->Directory,
						FileSystem::fileNameFromPath( file.second.Filepath ), Actions::Add );
				}
			}
		}
	}

	return wd;
}